

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O3

char * __thiscall
axl::cry::AppStoreReceiptPayloadParser::decode
          (AppStoreReceiptPayloadParser *this,State state,int expectedTag,char *unexpectedTagError,
          char *p,size_t size)

{
  size_t *psVar1;
  AttributeId AVar2;
  AppStoreReceipt *pAVar3;
  AppStoreIap *pAVar4;
  int iVar5;
  ListLink *link;
  EVP_PKEY_CTX *pEVar6;
  uint64_t uVar7;
  AppStoreIap *pAVar8;
  char *unexpectedTagError_00;
  AppStoreIap *pAVar9;
  State state_00;
  long lVar10;
  EVP_PKEY_CTX *pEVar11;
  int tag;
  long length;
  int cls;
  EVP_PKEY_CTX *local_80;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_78;
  int local_5c;
  EVP_PKEY_CTX *local_58;
  int local_4c;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  
  local_80 = (EVP_PKEY_CTX *)p;
  iVar5 = ASN1_get_object((uchar **)&local_80,(long *)&local_58,&local_5c,&local_4c,size);
  if ((char)iVar5 < '\0') {
    pEVar6 = (EVP_PKEY_CTX *)failWithLastCryptoError<char_const*>((char *)0x0);
    return (char *)pEVar6;
  }
  if (local_5c != expectedTag) {
    err::Error::Error((Error *)&local_78,unexpectedTagError);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_78);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
    goto LAB_00128da5;
  }
  pEVar6 = local_80 + (long)local_58;
  pEVar11 = pEVar6;
  switch(state) {
  case State_Set:
    pEVar11 = (EVP_PKEY_CTX *)0x0;
    do {
      if (pEVar6 <= local_80) {
        return (char *)pEVar6;
      }
      local_80 = (EVP_PKEY_CTX *)
                 decode(this,State_Attribute,0x10,
                        "invalid app receipt attribute (expected ASN1 SEQUENCE)",(char *)local_80,
                        (long)pEVar6 - (long)local_80);
    } while (local_80 != (EVP_PKEY_CTX *)0x0);
    break;
  case State_Attribute:
    this->m_attributeId = AttributeId_Undefined;
    this->m_attributeString = (String *)0x0;
    this->m_attributeInteger = &this->m_attributeId;
    this->m_attributeIntegerSize = 4;
    local_80 = (EVP_PKEY_CTX *)
               decode(this,State_AttributeIntegerValue,2,
                      "invalid app receipt attribute type (expected ASN1 INTEGER)",(char *)local_80,
                      (size_t)local_58);
    if (local_80 != (EVP_PKEY_CTX *)0x0) {
      this->m_attributeInteger = (void *)0x0;
      local_80 = (EVP_PKEY_CTX *)
                 decode(this,State_AttributeIntegerValue,2,
                        "invalid app receipt attribute version (expected ASN1 INTEGER)",
                        (char *)local_80,(long)pEVar6 - (long)local_80);
      if (local_80 == (EVP_PKEY_CTX *)0x0) goto LAB_00128da5;
      local_58 = pEVar6 + -(long)local_80;
      unexpectedTagError_00 = "invalid app receipt attribute value (expected ASN1 OCTET STRING)";
      state_00 = State_AttributeValue;
      iVar5 = 4;
LAB_001291d4:
      local_80 = (EVP_PKEY_CTX *)
                 decode(this,state_00,iVar5,unexpectedTagError_00,(char *)local_80,(size_t)local_58)
      ;
      goto LAB_001291d9;
    }
    goto LAB_00128da5;
  case State_AttributeValue:
    AVar2 = this->m_attributeId;
    if (0x6a4 < (int)AVar2) {
      switch(AVar2) {
      case AttributeId_IapQuantity:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeInteger = &this->m_iap->m_quantity;
          this->m_attributeIntegerSize = 8;
          unexpectedTagError_00 = "invalid app receipt IAP quantity (expected ASN1 INTEGER)";
LAB_00128ffc:
          state_00 = State_AttributeIntegerValue;
          iVar5 = 2;
          goto LAB_001291d4;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      case AttributeId_IapProductId:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeString = &this->m_iap->m_productId;
          unexpectedTagError_00 = "invalid app receipt IAP product ID (expected ASN1 UTF8 STRING)";
          goto LAB_001291c4;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      case AttributeId_IapTransactionId:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeString = &this->m_iap->m_transactionId;
          unexpectedTagError_00 =
               "invalid app receipt IAP transaction ID (expected ASN1 UTF8 STRING)";
          goto LAB_001291c4;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      case AttributeId_IapPurchaseDate:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeString = &this->m_iap->m_purchaseDateString;
          local_80 = (EVP_PKEY_CTX *)
                     decode(this,State_AttributeStringValue,0x16,
                            "invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
                            (char *)local_80,(size_t)local_58);
          uVar7 = decodeRfc3339Timestamp
                            (&(this->m_iap->m_purchaseDateString).
                              super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
          this->m_iap->m_purchaseTimestamp = uVar7;
          goto switchD_00128dfe_caseD_6ab;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      case AttributeId_IapOriginalTransactionId:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeString = &this->m_iap->m_originalTransactionId;
          unexpectedTagError_00 =
               "invalid app receipt IAP original transaction ID (expected ASN1 UTF8 STRING)";
          goto LAB_001291c4;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      case AttributeId_IapOriginalPurchaseDate:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeString = &this->m_iap->m_originalPurchaseDateString;
          local_80 = (EVP_PKEY_CTX *)
                     decode(this,State_AttributeStringValue,0x16,
                            "invalid app receipt IAP original purchase date (expected ASN1 IA5 STRING)"
                            ,(char *)local_80,(size_t)local_58);
          uVar7 = decodeRfc3339Timestamp
                            (&(this->m_iap->m_originalPurchaseDateString).
                              super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
          this->m_iap->m_originalPurchaseTimestamp = uVar7;
          goto switchD_00128dfe_caseD_6ab;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      default:
        goto switchD_00128dfe_caseD_6ab;
      case AttributeId_IapSubscriptionExpirationDate:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeString = &this->m_iap->m_subscriptionExpirationDateString;
          local_80 = (EVP_PKEY_CTX *)
                     decode(this,State_AttributeStringValue,0x16,
                            "invalid app receipt IAP subscription expiration date (expected ASN1 IA5 STRING)"
                            ,(char *)local_80,(size_t)local_58);
          uVar7 = decodeRfc3339Timestamp
                            (&(this->m_iap->m_subscriptionExpirationDateString).
                              super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
          this->m_iap->m_subscriptionExpirationTimestamp = uVar7;
          goto switchD_00128dfe_caseD_6ab;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      case AttributeId_IapWebOrderLineItemId:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeInteger = &this->m_iap->m_webOrderLineItemId;
          this->m_attributeIntegerSize = 4;
          unexpectedTagError_00 =
               "invalid app receipt IAP web order line item ID (expected ASN1 INTEGER)";
          goto LAB_00128ffc;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
        break;
      case AttributeId_IapCancellationDate:
        if (this->m_iap != (AppStoreIap *)0x0) {
          this->m_attributeString = &this->m_iap->m_cancellationDateString;
          local_80 = (EVP_PKEY_CTX *)
                     decode(this,State_AttributeStringValue,0x16,
                            "invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
                            (char *)local_80,(size_t)local_58);
          uVar7 = decodeRfc3339Timestamp
                            (&(this->m_iap->m_cancellationDateString).
                              super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
          this->m_iap->m_cancellationTimestamp = uVar7;
          goto switchD_00128dfe_caseD_6ab;
        }
        err::ErrorRef::ErrorRef((ErrorRef *)&local_78,"unexpected IAP attribute in app receipt");
        err::setError((ErrorRef *)&local_78);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_78);
      }
      goto LAB_00128da5;
    }
    switch(AVar2) {
    case AttributeId_BundleId:
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                (&this->m_receipt->m_rawBundleId,local_80,local_58);
      this->m_attributeString = &this->m_receipt->m_bundleId;
      unexpectedTagError_00 = "invalid app receipt bundle ID (expected ASN1 UTF8 STRING)";
      state_00 = State_AttributeStringValue;
      iVar5 = 0xc;
      goto LAB_001291d4;
    case AttributeId_AppVersion:
      this->m_attributeString = &this->m_receipt->m_appVersion;
      unexpectedTagError_00 = "invalid app receipt version (expected ASN1 UTF8 STRING)";
LAB_001291c4:
      state_00 = State_AttributeStringValue;
      iVar5 = 0xc;
      goto LAB_001291d4;
    case AttributeId_Opaque:
      lVar10 = 200;
      goto LAB_00128f7e;
    case AttributeId_Sha1Hash:
      lVar10 = 0xe0;
LAB_00128f7e:
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)
                 ((long)&(this->m_receipt->m_bundleId).
                         super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p + lVar10),
                 local_80,local_58);
      break;
    case AttributeId_Opaque|AttributeId_BundleId:
    case AttributeId_Opaque|AttributeId_AppVersion:
    case 8:
    case 9:
    case 10:
    case 0xb:
      break;
    case AttributeId_ReceiptCreationDate:
      this->m_attributeString = &this->m_receipt->m_receiptCreationDateString;
      local_80 = (EVP_PKEY_CTX *)
                 decode(this,State_AttributeStringValue,0x16,
                        "invalid app receipt creation date (expected ASN1 IA5 STRING)",
                        (char *)local_80,(size_t)local_58);
      uVar7 = decodeRfc3339Timestamp
                        (&(this->m_receipt->m_receiptCreationDateString).
                          super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      this->m_receipt->m_receiptCreationTimestamp = uVar7;
      break;
    default:
      if (AVar2 != AttributeId_Iap) {
        if (AVar2 != AttributeId_OriginalAppVersion) break;
        this->m_attributeString = &this->m_receipt->m_originalAppVersion;
        unexpectedTagError_00 = "invalid app receipt original version (expected ASN1 UTF8 STRING)";
        goto LAB_001291c4;
      }
      pAVar3 = this->m_receipt;
      pAVar8 = (AppStoreIap *)operator_new(0x120);
      (pAVar8->m_productId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
           (C *)0x0;
      (pAVar8->m_productId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr =
           (BufHdr *)0x0;
      *(undefined8 *)
       ((long)&(pAVar8->m_productId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
               m_hdr + 1) = 0;
      *(undefined8 *)
       ((long)&(pAVar8->m_productId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
               m_length + 1) = 0;
      (pAVar8->m_transactionId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
           (C *)0x0;
      (pAVar8->m_transactionId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr =
           (BufHdr *)0x0;
      *(undefined8 *)
       ((long)&(pAVar8->m_transactionId).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1) = 0;
      *(undefined8 *)
       ((long)&(pAVar8->m_transactionId).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length + 1) = 0;
      (pAVar8->m_originalTransactionId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
      .m_p = (C *)0x0;
      (pAVar8->m_originalTransactionId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
      .m_hdr = (BufHdr *)0x0;
      *(undefined8 *)
       ((long)&(pAVar8->m_originalTransactionId).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1) = 0;
      *(undefined8 *)
       ((long)&(pAVar8->m_originalTransactionId).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length + 1) = 0;
      (pAVar8->m_purchaseDateString).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
      m_p = (C *)0x0;
      (pAVar8->m_purchaseDateString).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
      m_hdr = (BufHdr *)0x0;
      *(undefined8 *)
       ((long)&(pAVar8->m_purchaseDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1) = 0;
      *(undefined8 *)
       ((long)&(pAVar8->m_purchaseDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length + 1) = 0;
      (pAVar8->m_originalPurchaseDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
      (pAVar8->m_originalPurchaseDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr = (BufHdr *)0x0;
      *(undefined8 *)
       ((long)&(pAVar8->m_originalPurchaseDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1) = 0;
      *(undefined8 *)
       ((long)&(pAVar8->m_originalPurchaseDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length + 1) = 0;
      (pAVar8->m_subscriptionExpirationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
      (pAVar8->m_subscriptionExpirationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr = (BufHdr *)0x0;
      *(undefined8 *)
       ((long)&(pAVar8->m_subscriptionExpirationDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1) = 0;
      *(undefined8 *)
       ((long)&(pAVar8->m_subscriptionExpirationDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length + 1) = 0;
      (pAVar8->m_cancellationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
      (pAVar8->m_cancellationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr = (BufHdr *)0x0;
      *(undefined8 *)
       ((long)&(pAVar8->m_cancellationDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1) = 0;
      *(undefined8 *)
       ((long)&(pAVar8->m_cancellationDateString).
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length + 1) = 0;
      pAVar8->m_quantity = 0;
      pAVar8->m_webOrderLineItemId = 0;
      pAVar8->m_purchaseTimestamp = 0;
      pAVar8->m_originalPurchaseTimestamp = 0;
      pAVar8->m_subscriptionExpirationTimestamp = 0;
      pAVar8->m_cancellationTimestamp = 0;
      pAVar4 = (pAVar3->m_iapList).
               super_OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
               .
               super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
               .super_ListData<axl::cry::AppStoreIap>.m_tail;
      (pAVar8->super_ListLink).m_next = (ListLink *)0x0;
      (pAVar8->super_ListLink).m_prev = &pAVar4->super_ListLink;
      pAVar9 = (AppStoreIap *)&pAVar3->m_iapList;
      if (pAVar4 != (AppStoreIap *)0x0) {
        pAVar9 = pAVar4;
      }
      (((OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
         *)&pAVar9->super_ListLink)->
      super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
      ).super_ListData<axl::cry::AppStoreIap>.m_head = pAVar8;
      (pAVar3->m_iapList).
      super_OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
      .
      super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
      .super_ListData<axl::cry::AppStoreIap>.m_tail = pAVar8;
      psVar1 = &(pAVar3->m_iapList).
                super_OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
                .
                super_ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
                .super_ListData<axl::cry::AppStoreIap>.m_count;
      *psVar1 = *psVar1 + 1;
      this->m_iap = pAVar8;
      local_80 = (EVP_PKEY_CTX *)
                 decode(this,State_Set,0x11,"invalid app receipt IAP (expected ASN1 SET)",
                        (char *)local_80,(long)pEVar6 - (long)local_80);
      this->m_iap = (AppStoreIap *)0x0;
      goto LAB_001291d9;
    }
switchD_00128dfe_caseD_6ab:
LAB_001291d9:
    if (local_80 == (EVP_PKEY_CTX *)0x0) {
LAB_00128da5:
      pEVar11 = (EVP_PKEY_CTX *)0x0;
    }
    break;
  case State_AttributeStringValue:
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (this->m_attributeString,local_80,local_58);
    break;
  case State_AttributeIntegerValue:
    if ((char *)this->m_attributeInteger != (char *)0x0) {
      pEVar6 = (EVP_PKEY_CTX *)this->m_attributeIntegerSize;
      if (local_58 < (EVP_PKEY_CTX *)this->m_attributeIntegerSize) {
        pEVar6 = local_58;
      }
      sl::ReverseArray<char>::copyReverse
                ((char *)this->m_attributeInteger,(char *)local_80,(size_t)pEVar6);
    }
  }
  return (char *)pEVar11;
}

Assistant:

const char*
AppStoreReceiptPayloadParser::decode(
	State state,
	int expectedTag,
	const char* unexpectedTagError,
	const char* p,
	size_t size
) {
	ASSERT(m_receipt);

	long length;
	int tag;
	int cls;

	int retCode = ASN1_get_object((const uchar_t**)&p, &length, &tag, &cls, size);
	if (retCode & 0x80)
		return failWithLastCryptoError<const char*>(NULL);

	if (tag != expectedTag)
		return err::fail<const char*>(NULL, unexpectedTagError);

	const char* end = p + length;

	switch (state) {
	case State_Set:
		while (p < end) {
			p = decode(
				State_Attribute,
				V_ASN1_SEQUENCE,
				"invalid app receipt attribute (expected ASN1 SEQUENCE)",
				p,
				end - p
			);

			if (!p)
				return NULL;
		}

		break;

	case State_Attribute:
		m_attributeId = AttributeId_Undefined;
		m_attributeString = NULL;
		m_attributeInteger = &m_attributeId;
		m_attributeIntegerSize = sizeof(m_attributeId);

		p = decode(
			State_AttributeIntegerValue,
			V_ASN1_INTEGER,
			"invalid app receipt attribute type (expected ASN1 INTEGER)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		m_attributeInteger = NULL; // ignore attribute version value

		p = decode(
			State_AttributeIntegerValue,
			V_ASN1_INTEGER,
			"invalid app receipt attribute version (expected ASN1 INTEGER)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		p = decode(
			State_AttributeValue,
			V_ASN1_OCTET_STRING,
			"invalid app receipt attribute value (expected ASN1 OCTET STRING)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		break;

	case State_AttributeValue:
		switch (m_attributeId) {
		case AttributeId_BundleId:
			m_receipt->m_rawBundleId.copy(p, length);
			m_attributeString = &m_receipt->m_bundleId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt bundle ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_AppVersion:
			m_attributeString = &m_receipt->m_appVersion;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt version (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_OriginalAppVersion:
			m_attributeString = &m_receipt->m_originalAppVersion;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt original version (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_ReceiptCreationDate:
			m_attributeString = &m_receipt->m_receiptCreationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt creation date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_receipt->m_receiptCreationTimestamp = decodeRfc3339Timestamp(m_receipt->m_receiptCreationDateString);
			break;

		case AttributeId_Iap:
			m_iap = *m_receipt->m_iapList.insertTail(new AppStoreIap);

			p = decode(
				State_Set,
				V_ASN1_SET,
				"invalid app receipt IAP (expected ASN1 SET)",
				p,
				end - p
			);

			m_iap = NULL;
			break;

		case AttributeId_Opaque:
			m_receipt->m_opaque.copy(p, length);
			break;

		case AttributeId_Sha1Hash:
			m_receipt->m_sha1Hash.copy(p, length);
			break;

		case AttributeId_IapQuantity:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeInteger = &m_iap->m_quantity;
			m_attributeIntegerSize = sizeof(m_iap->m_quantity);

			p = decode(
				State_AttributeIntegerValue,
				V_ASN1_INTEGER,
				"invalid app receipt IAP quantity (expected ASN1 INTEGER)",
				p,
				length
			);
			break;

		case AttributeId_IapProductId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_productId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP product ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapTransactionId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_transactionId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP transaction ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapPurchaseDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_purchaseDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_purchaseTimestamp = decodeRfc3339Timestamp(m_iap->m_purchaseDateString);
			break;

		case AttributeId_IapOriginalTransactionId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_originalTransactionId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP original transaction ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapOriginalPurchaseDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_originalPurchaseDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP original purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_originalPurchaseTimestamp = decodeRfc3339Timestamp(m_iap->m_originalPurchaseDateString);
			break;

		case AttributeId_IapSubscriptionExpirationDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_subscriptionExpirationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP subscription expiration date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_subscriptionExpirationTimestamp = decodeRfc3339Timestamp(m_iap->m_subscriptionExpirationDateString);
			break;

		case AttributeId_IapWebOrderLineItemId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeInteger = &m_iap->m_webOrderLineItemId;
			m_attributeIntegerSize = sizeof(m_iap->m_webOrderLineItemId);

			p = decode(
				State_AttributeIntegerValue,
				V_ASN1_INTEGER,
				"invalid app receipt IAP web order line item ID (expected ASN1 INTEGER)",
				p,
				length
			);

			break;

		case AttributeId_IapCancellationDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_cancellationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_cancellationTimestamp = decodeRfc3339Timestamp(m_iap->m_cancellationDateString);
			break;

		default:
			AXL_TRACE("WARNING: unsupported AppStore Receipt attribute ID: 0x%x\n", m_attributeId);
		}

		if (!p)
			return NULL;

		break;

	case State_AttributeStringValue:
		ASSERT(m_attributeString);
		m_attributeString->copy(p, length);
		break;

	case State_AttributeIntegerValue:
		if (m_attributeInteger) {
			size_t size = AXL_MIN((size_t)length, m_attributeIntegerSize);
			sl::ArrayDetails<char>::copyReverse((char*)m_attributeInteger, p, size); // big-endian
		}

		break;

	default:
		ASSERT(false);
	}

	return end;
}